

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_unique_ptr.hpp
# Opt level: O3

void __thiscall
Catch::Detail::
unique_ptr<Catch::Generators::FixedValuesGenerator<std::tuple<double,_double,_double>_>_>::
~unique_ptr(unique_ptr<Catch::Generators::FixedValuesGenerator<std::tuple<double,_double,_double>_>_>
            *this)

{
  FixedValuesGenerator<std::tuple<double,_double,_double>_> *this_00;
  pointer ptVar1;
  
  this_00 = this->m_ptr;
  if (this_00 != (FixedValuesGenerator<std::tuple<double,_double,_double>_> *)0x0) {
    ptVar1 = (this_00->m_values).
             super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (ptVar1 != (pointer)0x0) {
      operator_delete(ptVar1,(long)(this_00->m_values).
                                   super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ptVar1
                     );
    }
    Generators::GeneratorUntypedBase::~GeneratorUntypedBase((GeneratorUntypedBase *)this_00);
  }
  operator_delete(this_00,0x50);
  return;
}

Assistant:

~unique_ptr() {
            delete m_ptr;
        }